

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-precede.cpp
# Opt level: O2

Clause * __thiscall value_precede::ex_s(value_precede *this,int si,int ti)

{
  IntVar *pIVar1;
  IntVar **ppIVar2;
  int iVar3;
  int iVar4;
  Clause *this_00;
  Lit *pLVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  this_00 = Reason_new(ti + 1);
  uVar8 = 0;
  uVar7 = 0;
  if (0 < si) {
    uVar7 = (ulong)(uint)si;
  }
  while (uVar7 != uVar8) {
    pIVar1 = (this->xs).data[uVar8];
    uVar8 = uVar8 + 1;
    iVar3 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xd])
                      (pIVar1,(long)*(int *)&(this->super_Propagator).field_0x14,1);
    pLVar5 = Clause::operator[](this_00,(int)uVar8);
    pLVar5->x = iVar3;
  }
  uVar6 = si + 1;
  iVar3 = (int)uVar8;
  while( true ) {
    iVar3 = iVar3 + 1;
    ppIVar2 = (this->xs).data;
    if (ti <= (int)uVar6) break;
    pIVar1 = ppIVar2[uVar6];
    iVar4 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xd])
                      (pIVar1,(long)*(int *)&(this->super_Propagator).field_0x14,1);
    pLVar5 = Clause::operator[](this_00,iVar3);
    pLVar5->x = iVar4;
    uVar6 = uVar6 + 1;
  }
  pIVar1 = ppIVar2[(uint)ti];
  iVar4 = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xd])(pIVar1,(long)this->t,0);
  pLVar5 = Clause::operator[](this_00,iVar3);
  pLVar5->x = iVar4;
  return this_00;
}

Assistant:

Clause* ex_s(int si, int ti) {
		Clause* r(Reason_new(ti + 1));
		int jj = 1;
		for (int ii = 0; ii < si; ++ii, ++jj) {
			(*r)[jj] = xs[ii]->getLit(s, LR_EQ);
		}
		for (int ii = si + 1; ii < ti; ++ii, ++jj) {
			(*r)[jj] = xs[ii]->getLit(s, LR_EQ);
		}
		(*r)[jj++] = xs[ti]->getLit(t, LR_NE);
		assert(jj == ti + 1);
		return r;
	}